

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

int mpc_test_pass(mpc_parser_t *p,char *s,void *d,_func_int_void_ptr_void_ptr *tester,
                 mpc_dtor_t destructor,_func_void_void_ptr *printer)

{
  int iVar1;
  mpc_result_t in_RAX;
  mpc_result_t r;
  
  r = in_RAX;
  iVar1 = mpc_parse("<test>",s,p,&r);
  if (iVar1 == 0) {
    mpc_err_print(r.error);
    mpc_err_delete(r.error);
    iVar1 = 0;
  }
  else {
    iVar1 = (*tester)(r.error,d);
    if (iVar1 == 0) {
      iVar1 = 0;
      printf("Got ");
      (*printer)(r.error);
      putchar(10);
      printf("Expected ");
      (*printer)(d);
      putchar(10);
      (*destructor)(r.error);
    }
    else {
      (*destructor)(r.error);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int mpc_test_pass(mpc_parser_t *p, const char *s, const void *d,
  int(*tester)(const void*, const void*),
  mpc_dtor_t destructor,
  void(*printer)(const void*)) {

  mpc_result_t r;
  if (mpc_parse("<test>", s, p, &r)) {

    if (tester(r.output, d)) {
      destructor(r.output);
      return 1;
    } else {
      printf("Got "); printer(r.output); printf("\n");
      printf("Expected "); printer(d); printf("\n");
      destructor(r.output);
      return 0;
    }

  } else {
    mpc_err_print(r.error);
    mpc_err_delete(r.error);
    return 0;

  }

}